

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_type
          (CompilerMSL *this,uint32_t mbr_type_id,SPIRType *struct_type,uint32_t *mbr_idx,
          uint32_t *arg_buff_index,uint32_t count)

{
  TypeID TVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint32_t uVar4;
  bool bVar5;
  bool bVar6;
  undefined2 uVar7;
  Dim DVar8;
  bool bVar9;
  undefined1 uVar10;
  ImageFormat IVar11;
  AccessQualifier AVar12;
  TypeID TVar13;
  uint32_t id;
  SPIRType *pSVar14;
  SPIRType *pSVar15;
  char (*ts_2) [5];
  string local_50;
  
  ts_2 = (char (*) [5])arg_buff_index;
  if (1 < count) {
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    pSVar14 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id);
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + mbr_type_id);
    (pSVar14->super_IVariant).self.id = (pSVar15->super_IVariant).self.id;
    uVar2 = pSVar15->vecsize;
    uVar4 = pSVar15->columns;
    *(undefined8 *)&(pSVar14->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar15->super_IVariant).field_0xc;
    pSVar14->vecsize = uVar2;
    pSVar14->columns = uVar4;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar14->array,&pSVar15->array);
    SmallVector<bool,_8UL>::operator=(&pSVar14->array_size_literal,&pSVar15->array_size_literal);
    bVar5 = pSVar15->pointer;
    bVar6 = pSVar15->forward_pointer;
    uVar7 = *(undefined2 *)&pSVar15->field_0x7e;
    pSVar14->pointer_depth = pSVar15->pointer_depth;
    pSVar14->pointer = bVar5;
    pSVar14->forward_pointer = bVar6;
    *(undefined2 *)&pSVar14->field_0x7e = uVar7;
    pSVar14->storage = pSVar15->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar14->member_types,&pSVar15->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar14->member_type_index_redirection,&pSVar15->member_type_index_redirection);
    DVar8 = (pSVar15->image).dim;
    bVar5 = (pSVar15->image).depth;
    bVar6 = (pSVar15->image).arrayed;
    bVar9 = (pSVar15->image).ms;
    uVar10 = (pSVar15->image).field_0xb;
    uVar2 = (pSVar15->image).sampled;
    IVar11 = (pSVar15->image).format;
    AVar12 = (pSVar15->image).access;
    TVar1.id = (pSVar15->type_alias).id;
    TVar13.id = (pSVar15->parent_type).id;
    (pSVar14->image).type = (TypeID)(pSVar15->image).type.id;
    (pSVar14->image).dim = DVar8;
    (pSVar14->image).depth = bVar5;
    (pSVar14->image).arrayed = bVar6;
    (pSVar14->image).ms = bVar9;
    (pSVar14->image).field_0xb = uVar10;
    (pSVar14->image).sampled = uVar2;
    (pSVar14->image).format = IVar11;
    (pSVar14->image).access = AVar12;
    pSVar14->type_alias = (TypeID)TVar1.id;
    pSVar14->parent_type = (TypeID)TVar13.id;
    if (pSVar15 != pSVar14) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar14->member_name_cache,&(pSVar15->member_name_cache)._M_h);
    }
    SmallVector<unsigned_int,_8UL>::reserve
              (&pSVar14->array,(pSVar14->array).super_VectorView<unsigned_int>.buffer_size + 1);
    sVar3 = (pSVar14->array).super_VectorView<unsigned_int>.buffer_size;
    (pSVar14->array).super_VectorView<unsigned_int>.ptr[sVar3] = count;
    (pSVar14->array).super_VectorView<unsigned_int>.buffer_size = sVar3 + 1;
    SmallVector<bool,_8UL>::reserve
              (&pSVar14->array_size_literal,
               (pSVar14->array_size_literal).super_VectorView<bool>.buffer_size + 1);
    sVar3 = (pSVar14->array_size_literal).super_VectorView<bool>.buffer_size;
    (pSVar14->array_size_literal).super_VectorView<bool>.ptr[sVar3] = true;
    (pSVar14->array_size_literal).super_VectorView<bool>.buffer_size = sVar3 + 1;
    (pSVar14->parent_type).id = mbr_type_id;
    mbr_type_id = id;
  }
  TVar1.id = (struct_type->super_IVariant).self.id;
  uVar2 = *mbr_idx;
  join<char_const(&)[3],unsigned_int&,char_const(&)[5]>
            (&local_50,(spirv_cross *)0x35c5ee,(char (*) [3])arg_buff_index,(uint *)"_pad",ts_2);
  Compiler::set_member_name((Compiler *)this,TVar1,uVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(struct_type->super_IVariant).self.id,*mbr_idx,
             SPIRVCrossDecorationResourceIndexPrimary,*arg_buff_index);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
            (&struct_type->member_types,
             (struct_type->member_types).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
  sVar3 = (struct_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
          .buffer_size;
  (struct_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  [sVar3].id = mbr_type_id;
  (struct_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = sVar3 + 1;
  *arg_buff_index = *arg_buff_index + count;
  *mbr_idx = *mbr_idx + 1;
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_type(uint32_t mbr_type_id, SPIRType &struct_type, uint32_t &mbr_idx,
                                                   uint32_t &arg_buff_index, uint32_t count)
{
	uint32_t type_id = mbr_type_id;
	if (count > 1)
	{
		uint32_t ary_type_id = ir.increase_bound_by(1);
		auto &ary_type = set<SPIRType>(ary_type_id);
		ary_type = get<SPIRType>(type_id);
		ary_type.array.push_back(count);
		ary_type.array_size_literal.push_back(true);
		ary_type.parent_type = type_id;
		type_id = ary_type_id;
	}

	set_member_name(struct_type.self, mbr_idx, join("_m", arg_buff_index, "_pad"));
	set_extended_member_decoration(struct_type.self, mbr_idx, SPIRVCrossDecorationResourceIndexPrimary, arg_buff_index);
	struct_type.member_types.push_back(type_id);

	arg_buff_index += count;
	mbr_idx++;
}